

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_factorize.c
# Opt level: O2

lu_int basiclu_factorize(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                        lu_int *Wi,double *Wx,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx,
                        lu_int c0ntinue)

{
  lu_int lVar1;
  int status;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_2e8 [84];
  lu_int local_294;
  undefined4 local_284;
  int local_27c;
  double local_240;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0 [4];
  int local_1b0;
  int local_1ac;
  int local_1a4;
  int local_1a0;
  int local_194;
  undefined4 local_170;
  undefined8 local_164;
  lu_int *local_148;
  lu_int *local_140;
  double *local_130;
  double *local_128;
  lu_int *local_c8;
  lu_int *local_98;
  lu_int *local_68;
  double *local_48;
  double *local_38;
  
  lVar1 = lu_load(local_2e8,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar1 != 0) {
    return lVar1;
  }
  auVar6._0_4_ = -(uint)((int)Bbegin == 0);
  auVar6._4_4_ = -(uint)((int)((ulong)Bbegin >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)Bend == 0);
  auVar6._12_4_ = -(uint)((int)((ulong)Bend >> 0x20) == 0);
  auVar9._4_4_ = auVar6._0_4_;
  auVar9._0_4_ = auVar6._4_4_;
  auVar9._8_4_ = auVar6._12_4_;
  auVar9._12_4_ = auVar6._8_4_;
  auVar8._0_4_ = -(uint)((int)Wi == 0);
  auVar8._4_4_ = -(uint)((int)((ulong)Wi >> 0x20) == 0);
  auVar8._8_4_ = -(uint)((int)Wx == 0);
  auVar8._12_4_ = -(uint)((int)((ulong)Wx >> 0x20) == 0);
  auVar7._4_4_ = auVar8._0_4_;
  auVar7._0_4_ = auVar8._4_4_;
  auVar7._8_4_ = auVar8._12_4_;
  auVar7._12_4_ = auVar8._8_4_;
  auVar8 = packssdw(auVar7 & auVar8,auVar9 & auVar6);
  auVar4._0_4_ = -(uint)((int)Ui == 0);
  auVar4._4_4_ = -(uint)((int)((ulong)Ui >> 0x20) == 0);
  auVar4._8_4_ = -(uint)((int)Ux == 0);
  auVar4._12_4_ = -(uint)((int)((ulong)Ux >> 0x20) == 0);
  auVar5._4_4_ = auVar4._0_4_;
  auVar5._0_4_ = auVar4._4_4_;
  auVar5._8_4_ = auVar4._12_4_;
  auVar5._12_4_ = auVar4._8_4_;
  auVar3._0_4_ = -(uint)((int)Li == 0);
  auVar3._4_4_ = -(uint)((int)((ulong)Li >> 0x20) == 0);
  auVar3._8_4_ = -(uint)((int)Lx == 0);
  auVar3._12_4_ = -(uint)((int)((ulong)Lx >> 0x20) == 0);
  auVar2._4_4_ = auVar3._0_4_;
  auVar2._0_4_ = auVar3._4_4_;
  auVar2._8_4_ = auVar3._12_4_;
  auVar2._12_4_ = auVar3._8_4_;
  auVar3 = packssdw(auVar2 & auVar3,auVar5 & auVar4);
  auVar3 = packssdw(auVar3,auVar8);
  if ((Bx == (double *)0x0 || Bi == (lu_int *)0x0) ||
      ((((((((auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar3[0xf] < '\0')) {
    status = -3;
    goto LAB_0038f509;
  }
  if (c0ntinue != 0) {
    switch(local_170) {
    case 1:
      goto switchD_0038f488_caseD_1;
    case 2:
      goto switchD_0038f488_caseD_2;
    case 3:
      goto switchD_0038f488_caseD_3;
    case 4:
      goto switchD_0038f488_caseD_4;
    default:
      status = -2;
      goto LAB_0038f509;
    }
  }
  lu_reset(local_2e8);
switchD_0038f488_caseD_1:
  local_170 = 1;
  status = lu_singletons(local_2e8,Bbegin,Bend,Bi,Bx);
  if (status != 0) goto LAB_0038f509;
switchD_0038f488_caseD_2:
  local_170 = 2;
  status = lu_setup_bump(local_2e8,Bbegin,Bend,Bi,Bx);
  if (status != 0) goto LAB_0038f509;
switchD_0038f488_caseD_3:
  local_170 = 3;
  status = lu_factorize_bump(local_2e8);
  if (status == 0) {
switchD_0038f488_caseD_4:
    local_170 = 4;
    status = lu_build_factors(local_2e8);
    if (status == 0) {
      local_170 = 0;
      local_284 = 0;
      local_164 = 0xffffffffffffffff;
      local_27c = local_27c + 1;
      local_1f8 = lu_condest(local_294,local_c8,local_148,local_130,(double *)0x0,local_98,0,
                             local_48,&local_1e8,&local_1d8);
      local_1f0 = lu_condest(local_294,local_68,local_140,local_128,local_38,local_98,1,local_48,
                             &local_1e0,local_1d0);
      lu_residual_test(local_2e8,Bbegin,Bend,Bi,Bx);
      local_240 = ((double)local_194 * 0.008 +
                  (double)local_1a0 * 0.2 +
                  (double)local_1a4 * 0.2 + (double)local_294 * 0.04 + (double)local_1b0 * 0.07) *
                  250.0;
      status = (uint)(local_1ac < local_294) * 2;
    }
  }
LAB_0038f509:
  lVar1 = lu_save(local_2e8,istore,xstore,status);
  return lVar1;
}

Assistant:

lu_int basiclu_factorize
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    const lu_int Bbegin[],
    const lu_int Bend[],
    const lu_int Bi[],
    const double Bx[],
    lu_int c0ntinue
)
{
    struct lu this;
    lu_int status;
    double factor_cost;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && Bbegin && Bend && Bi && Bx))
    {
        status = BASICLU_ERROR_argument_missing;
        return lu_save(&this, istore, xstore, status);
    }
    if (!c0ntinue)
    {
        lu_reset(&this);
        this.task = SINGLETONS;
    }

    /* continue factorization */
    switch (this.task)
    {
    case SINGLETONS: goto singletons;
    case SETUP_BUMP: goto setup_bump;
    case FACTORIZE_BUMP: goto factorize_bump;
    case BUILD_FACTORS: goto build_factors;
    }
    status = BASICLU_ERROR_invalid_call;
    return lu_save(&this, istore, xstore, status);

    /*
     * Each of the following four parts of the factorization calls a routine
     * lu_do_something() which may request reallocation. In this case return
     * to the caller immediately, keeping the entry point in this.task.
     */

singletons:
    this.task = SINGLETONS;
    status = lu_singletons(&this, Bbegin, Bend, Bi, Bx);
    if (status != BASICLU_OK)
        goto return_to_caller;

setup_bump:
    this.task = SETUP_BUMP;
    status = lu_setup_bump(&this, Bbegin, Bend, Bi, Bx);
    if (status != BASICLU_OK)
        goto return_to_caller;

factorize_bump:
    this.task = FACTORIZE_BUMP;
    status = lu_factorize_bump(&this);
    if (status != BASICLU_OK)
        goto return_to_caller;

build_factors:
    this.task = BUILD_FACTORS;
    status = lu_build_factors(&this);
    if (status != BASICLU_OK)
        goto return_to_caller;

    /* factorization successfully finished */
    this.task               = NO_TASK;
    this.nupdate            =  0; /* make factorization valid */
    this.ftran_for_update   = -1;
    this.btran_for_update   = -1;
    this.nfactorize++;

    this.condestL = lu_condest(this.m, this.Lbegin, this.Lindex, this.Lvalue,
                               NULL, this.p, 0, this.work1,
                               &this.normL, &this.normestLinv);
    this.condestU = lu_condest(this.m, this.Ubegin, this.Uindex, this.Uvalue,
                               this.row_pivot, this.p, 1, this.work1,
                               &this.normU, &this.normestUinv);

    /* measure numerical stability of the factorization */
    lu_residual_test(&this, Bbegin, Bend, Bi, Bx);

    /*
     * factor_cost is a deterministic measure of the factorization cost.
     * The parameters have been adjusted such that (on my computer)
     * 1e-6 * factor_cost =~ time_factorize.
     *
     * update_cost measures the accumulated cost of updates/solves compared
     * to the last factorization. It is computed from
     *
     *   update_cost = update_cost_numer / update_cost_denom.
     *
     * update_cost_denom is fixed here.
     * update_cost_numer is zero here and increased by solves/updates.
     *
     */
    factor_cost =
        0.04 * this.m +
        0.07 * this.matrix_nz +
        0.20 * this.bump_nz +
        0.20 * this.nsearch_pivot +
        0.008 * this.factor_flops;

    this.update_cost_denom = factor_cost * 250;

    if (this.rank < this.m)
        status = BASICLU_WARNING_singular_matrix;

return_to_caller:
    return lu_save(&this, istore, xstore, status);
}